

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_example1.c
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint64_t uVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  roaring_bitmap_t *prVar7;
  roaring_uint32_iterator_t *prVar8;
  uint32_t j;
  uint32_t ret;
  uint32_t buffer [256];
  roaring_uint32_iterator_t *i;
  uint32_t counter;
  char *reason_failure;
  size_t sizeofbitmap;
  char *reason;
  roaring_bitmap_t *t;
  char *serializedbytes;
  uint32_t expectedsize;
  roaring_bitmap_t *i1_2;
  roaring_bitmap_t *bigunionheap;
  roaring_bitmap_t *bigunion;
  roaring_bitmap_t *allmybitmaps [3];
  roaring_bitmap_t *r1_2_3;
  roaring_bitmap_t *z;
  uint32_t *arr3;
  size_t limit;
  size_t offset;
  roaring_bitmap_t *r1f;
  uint32_t *arr1;
  uint64_t card1;
  roaring_bitmap_t *r3;
  uint32_t somevalues [3];
  roaring_bitmap_t *r2;
  uint32_t expectedsizerun;
  uint32_t expectedsizebasic;
  uint32_t cardinality;
  uint32_t i_1;
  roaring_bitmap_t *r1;
  undefined4 in_stack_fffffffffffffad8;
  int in_stack_fffffffffffffadc;
  undefined4 in_stack_fffffffffffffae0;
  uint uVar9;
  uint32_t in_stack_fffffffffffffae4;
  undefined4 in_stack_fffffffffffffae8;
  uint32_t in_stack_fffffffffffffaec;
  roaring_bitmap_t *in_stack_fffffffffffffaf0;
  roaring_uint32_iterator_t *in_stack_fffffffffffffaf8;
  uint32_t in_stack_fffffffffffffb1c;
  roaring_bitmap_t *in_stack_fffffffffffffb20;
  roaring_bitmap_t *in_stack_fffffffffffffb28;
  roaring_bitmap_t *in_stack_fffffffffffffb30;
  roaring_bitmap_t *in_stack_fffffffffffffb38;
  roaring_bitmap_t *in_stack_fffffffffffffb40;
  roaring_bitmap_t *in_stack_fffffffffffffb70;
  roaring_bitmap_t *in_stack_fffffffffffffb78;
  roaring_bitmap_t **in_stack_fffffffffffffb90;
  uint32_t in_stack_fffffffffffffb9c;
  uint local_14;
  int local_4;
  
  tellmeall();
  roaring_bitmap_create();
  for (local_14 = 100; local_14 < 1000; local_14 = local_14 + 1) {
    roaring_bitmap_add(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
  }
  roaring_bitmap_contains
            ((roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
             in_stack_fffffffffffffae4);
  _assert_true((unsigned_long)in_stack_fffffffffffffaf0,
               (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               in_stack_fffffffffffffadc);
  uVar3 = roaring_bitmap_get_cardinality(in_stack_fffffffffffffaf0);
  printf("Cardinality = %d \n",uVar3 & 0xffffffff);
  sVar4 = roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)0x10244a);
  roaring_bitmap_run_optimize(in_stack_fffffffffffffaf0);
  sVar5 = roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)0x10246b);
  printf("size before run optimize %d bytes, and after %d bytes\n",sVar4 & 0xffffffff,
         sVar5 & 0xffffffff);
  roaring_bitmap_of_ptr
            (CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
             (uint32_t *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  roaring_bitmap_printf
            ((roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
  roaring_bitmap_of_ptr
            (CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
             (uint32_t *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  uVar3 = roaring_bitmap_get_cardinality(in_stack_fffffffffffffaf0);
  pvVar6 = malloc(uVar3 << 2);
  _assert_true((unsigned_long)in_stack_fffffffffffffaf0,
               (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               in_stack_fffffffffffffadc);
  roaring_bitmap_to_uint32_array
            ((roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
             (uint32_t *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  roaring_bitmap_of_ptr
            (CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
             (uint32_t *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  free(pvVar6);
  roaring_bitmap_equals((roaring_bitmap_t *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  _assert_true((unsigned_long)in_stack_fffffffffffffaf0,
               (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               in_stack_fffffffffffffadc);
  roaring_bitmap_free((roaring_bitmap_t *)0x1025f6);
  pvVar6 = malloc(4000);
  _assert_true((unsigned_long)in_stack_fffffffffffffaf0,
               (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               in_stack_fffffffffffffadc);
  roaring_bitmap_range_uint32_array
            (in_stack_fffffffffffffaf0,CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
             ,CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
             (uint32_t *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  free(pvVar6);
  roaring_bitmap_copy((roaring_bitmap_t *)in_stack_fffffffffffffaf8);
  roaring_bitmap_equals((roaring_bitmap_t *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  _assert_true((unsigned_long)in_stack_fffffffffffffaf0,
               (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               in_stack_fffffffffffffadc);
  roaring_bitmap_free((roaring_bitmap_t *)0x1026db);
  roaring_bitmap_or(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  roaring_bitmap_or_inplace(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  roaring_bitmap_or_many
            (CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
             (roaring_bitmap_t **)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
  roaring_bitmap_equals((roaring_bitmap_t *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  _assert_true((unsigned_long)in_stack_fffffffffffffaf0,
               (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               in_stack_fffffffffffffadc);
  roaring_bitmap_or_many_heap(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb90);
  roaring_bitmap_equals((roaring_bitmap_t *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  _assert_true((unsigned_long)in_stack_fffffffffffffaf0,
               (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               in_stack_fffffffffffffadc);
  roaring_bitmap_free((roaring_bitmap_t *)0x1027e6);
  roaring_bitmap_free((roaring_bitmap_t *)0x1027f3);
  roaring_bitmap_free((roaring_bitmap_t *)0x102800);
  roaring_bitmap_and(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  roaring_bitmap_free((roaring_bitmap_t *)0x10282a);
  sVar4 = roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)0x102837);
  pvVar6 = malloc(sVar4 & 0xffffffff);
  roaring_bitmap_portable_serialize
            ((roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
             (char *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  prVar7 = roaring_bitmap_portable_deserialize_safe
                     ((char *)in_stack_fffffffffffffaf8,(size_t)in_stack_fffffffffffffaf0);
  if (prVar7 == (roaring_bitmap_t *)0x0) {
    local_4 = 1;
  }
  else {
    _Var1 = roaring_bitmap_internal_validate
                      ((roaring_bitmap_t *)in_stack_fffffffffffffaf8,
                       (char **)in_stack_fffffffffffffaf0);
    if (_Var1) {
      roaring_bitmap_equals((roaring_bitmap_t *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0)
      ;
      _assert_true((unsigned_long)in_stack_fffffffffffffaf0,
                   (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                   (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                   in_stack_fffffffffffffadc);
      roaring_bitmap_free((roaring_bitmap_t *)0x102918);
      sVar4 = roaring_bitmap_portable_deserialize_size
                        ((char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                         CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      printf("\nsizeofbitmap = %zu \n",sVar4);
      _assert_true((unsigned_long)in_stack_fffffffffffffaf0,
                   (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                   (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                   in_stack_fffffffffffffadc);
      prVar7 = roaring_bitmap_portable_deserialize_safe
                         ((char *)in_stack_fffffffffffffaf8,(size_t)in_stack_fffffffffffffaf0);
      if (prVar7 == (roaring_bitmap_t *)0x0) {
        printf("Problem during deserialization.\n");
        local_4 = 1;
      }
      else {
        _Var1 = roaring_bitmap_internal_validate
                          ((roaring_bitmap_t *)in_stack_fffffffffffffaf8,
                           (char **)in_stack_fffffffffffffaf0);
        if (_Var1) {
          roaring_bitmap_equals
                    ((roaring_bitmap_t *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
          _assert_true((unsigned_long)in_stack_fffffffffffffaf0,
                       (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                       (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                       in_stack_fffffffffffffadc);
          roaring_bitmap_free((roaring_bitmap_t *)0x102a54);
          free(pvVar6);
          roaring_iterate((roaring_bitmap_t *)in_stack_fffffffffffffaf8,
                          (roaring_iterator)in_stack_fffffffffffffaf0,
                          (void *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
          prVar8 = roaring_iterator_create
                             ((roaring_bitmap_t *)
                              CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
          while ((prVar8->has_value & 1U) != 0) {
            roaring_uint32_iterator_advance
                      ((roaring_uint32_iterator_t *)
                       CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
          }
          roaring_uint32_iterator_free((roaring_uint32_iterator_t *)0x102ae3);
          roaring_iterator_create
                    ((roaring_bitmap_t *)
                     CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
          do {
            uVar2 = roaring_uint32_iterator_read
                              (in_stack_fffffffffffffaf8,(uint32_t *)in_stack_fffffffffffffaf0,
                               in_stack_fffffffffffffaec);
            for (uVar9 = 0; uVar9 < uVar2; uVar9 = uVar9 + 1) {
            }
          } while (0xff < uVar2);
          roaring_uint32_iterator_free((roaring_uint32_iterator_t *)0x102b63);
          roaring_bitmap_free((roaring_bitmap_t *)0x102b70);
          roaring_bitmap_free((roaring_bitmap_t *)0x102b7d);
          roaring_bitmap_free((roaring_bitmap_t *)0x102b8a);
          printf("Success.\n");
          local_4 = 0;
        }
        else {
          printf("safely deserialized invalid bitmap: %s\n",0);
          local_4 = 1;
        }
      }
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int main() {
    tellmeall();
    // create a new empty bitmap
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    // then we can add values
    for (uint32_t i = 100; i < 1000; i++) roaring_bitmap_add(r1, i);
    // check whether a value is contained
    assert_true(roaring_bitmap_contains(r1, 500));
    // compute how many bits there are:
    uint32_t cardinality = roaring_bitmap_get_cardinality(r1);
    printf("Cardinality = %d \n", cardinality);

    // if your bitmaps have long runs, you can compress them by calling
    // run_optimize
    uint32_t expectedsizebasic = roaring_bitmap_portable_size_in_bytes(r1);
    roaring_bitmap_run_optimize(r1);
    uint32_t expectedsizerun = roaring_bitmap_portable_size_in_bytes(r1);
    printf("size before run optimize %d bytes, and after %d bytes\n",
           expectedsizebasic, expectedsizerun);
    // create a new bitmap containing the values {1,2,3,5,6}
    roaring_bitmap_t *r2 = roaring_bitmap_from(1, 2, 3, 5, 6);
    roaring_bitmap_printf(r2);  // print it

    // we can also create a bitmap from a pointer to 32-bit integers
    uint32_t somevalues[] = {2, 3, 4};
    roaring_bitmap_t *r3 = roaring_bitmap_of_ptr(3, somevalues);

    // we can also go in reverse and go from arrays to bitmaps
    uint64_t card1 = roaring_bitmap_get_cardinality(r1);
    uint32_t *arr1 = (uint32_t *)malloc(card1 * sizeof(uint32_t));
    assert_true(arr1 != NULL);
    roaring_bitmap_to_uint32_array(r1, arr1);
    roaring_bitmap_t *r1f = roaring_bitmap_of_ptr(card1, arr1);
    free(arr1);
    assert_true(roaring_bitmap_equals(r1, r1f));  // what we recover is equal
    roaring_bitmap_free(r1f);

    // we can go from arrays to bitmaps from "offset" by "limit"
    size_t offset = 100;
    size_t limit = 1000;
    uint32_t *arr3 = (uint32_t *)malloc(limit * sizeof(uint32_t));
    assert_true(arr3 != NULL);
    roaring_bitmap_range_uint32_array(r1, offset, limit, arr3);
    free(arr3);

    // we can copy and compare bitmaps
    roaring_bitmap_t *z = roaring_bitmap_copy(r3);
    assert_true(roaring_bitmap_equals(r3, z));  // what we recover is equal
    roaring_bitmap_free(z);

    // we can compute union two-by-two
    roaring_bitmap_t *r1_2_3 = roaring_bitmap_or(r1, r2);
    roaring_bitmap_or_inplace(r1_2_3, r3);

    // we can compute a big union
    const roaring_bitmap_t *allmybitmaps[] = {r1, r2, r3};
    roaring_bitmap_t *bigunion = roaring_bitmap_or_many(3, allmybitmaps);
    assert_true(
        roaring_bitmap_equals(r1_2_3, bigunion));  // what we recover is equal
    // can also do the big union with a heap
    roaring_bitmap_t *bigunionheap =
        roaring_bitmap_or_many_heap(3, allmybitmaps);
    assert_true(roaring_bitmap_equals(r1_2_3, bigunionheap));

    roaring_bitmap_free(r1_2_3);
    roaring_bitmap_free(bigunion);
    roaring_bitmap_free(bigunionheap);

    // we can compute intersection two-by-two
    roaring_bitmap_t *i1_2 = roaring_bitmap_and(r1, r2);
    roaring_bitmap_free(i1_2);

    // we can write a bitmap to a pointer and recover it later
    uint32_t expectedsize = roaring_bitmap_portable_size_in_bytes(r1);
    char *serializedbytes = (char *)malloc(expectedsize);
    roaring_bitmap_portable_serialize(r1, serializedbytes);
    roaring_bitmap_t *t =
        roaring_bitmap_portable_deserialize_safe(serializedbytes, expectedsize);
    if (t == NULL) {
        return EXIT_FAILURE;
    }
    const char *reason = NULL;
    if (!roaring_bitmap_internal_validate(t, &reason)) {
        return EXIT_FAILURE;
    }
    assert_true(roaring_bitmap_equals(r1, t));  // what we recover is equal
    roaring_bitmap_free(t);
    // we can also check whether there is a bitmap at a memory location without
    // reading it
    size_t sizeofbitmap =
        roaring_bitmap_portable_deserialize_size(serializedbytes, expectedsize);
    printf("\nsizeofbitmap = %zu \n", sizeofbitmap);
    assert_true(
        sizeofbitmap ==
        expectedsize);  // sizeofbitmap would be zero if no bitmap were found
    // we can also read the bitmap "safely" by specifying a byte size limit:
    t = roaring_bitmap_portable_deserialize_safe(serializedbytes, expectedsize);
    if (t == NULL) {
        printf("Problem during deserialization.\n");
        // We could clear any memory and close any file here.
        return EXIT_FAILURE;
    }
    // We can validate the bitmap we recovered to make sure it is proper.
    const char *reason_failure = NULL;
    if (!roaring_bitmap_internal_validate(t, &reason_failure)) {
        printf("safely deserialized invalid bitmap: %s\n", reason_failure);
        // We could clear any memory and close any file here.
        return EXIT_FAILURE;
    }
    assert_true(roaring_bitmap_equals(r1, t));  // what we recover is equal
    roaring_bitmap_free(t);

    free(serializedbytes);

    // we can iterate over all values using custom functions
    uint32_t counter = 0;
    roaring_iterate(r1, roaring_iterator_sumall, &counter);

    // we can also create iterator structs
    counter = 0;
    roaring_uint32_iterator_t *i = roaring_iterator_create(r1);
    while (i->has_value) {
        counter++;  // could use    i->current_value
        roaring_uint32_iterator_advance(i);
    }
    // you can skip over values and move the iterator with
    // roaring_uint32_iterator_move_equalorlarger(i,someintvalue)

    roaring_uint32_iterator_free(i);
    // roaring_bitmap_get_cardinality(r1) == counter

    // for greater speed, you can iterate over the data in bulk
    i = roaring_iterator_create(r1);
    uint32_t buffer[256];
    while (1) {
        uint32_t ret = roaring_uint32_iterator_read(i, buffer, 256);
        for (uint32_t j = 0; j < ret; j++) {
            counter += buffer[j];
        }
        if (ret < 256) {
            break;
        }
    }
    roaring_uint32_iterator_free(i);

    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);
    roaring_bitmap_free(r3);
    printf("Success.\n");
    return EXIT_SUCCESS;
}